

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O3

void dsfmt_fill_array_close_open(dsfmt_t *dsfmt,double *array,int size)

{
  undefined8 *puVar1;
  double *pdVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  undefined8 uVar8;
  double *pdVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uint64_t t0;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  uint64_t t1;
  ulong uVar16;
  uint64_t t1_2;
  ulong uVar17;
  ulong uVar18;
  uint64_t uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  if ((size & 1U) != 0) {
    __assert_fail("size % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x21e,"void dsfmt_fill_array_close_open(dsfmt_t *, double *, int)");
  }
  if (size < 0x17e) {
    __assert_fail("size >= DSFMT_N64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x21f,"void dsfmt_fill_array_close_open(dsfmt_t *, double *, int)");
  }
  auVar4 = *(undefined1 (*) [16])dsfmt->status[0].u;
  auVar23._0_8_ = auVar4._0_8_ << 0x13;
  auVar23._8_8_ = auVar4._8_8_ << 0x13;
  auVar21._4_4_ = *(undefined4 *)((long)dsfmt->status + 0xbf8);
  auVar21._0_4_ = *(undefined4 *)((long)dsfmt->status + 0xbfc);
  auVar21._8_4_ = *(undefined4 *)((long)dsfmt->status + 0xbf4);
  auVar21._12_4_ = dsfmt->status[0xbf].u32[0];
  auVar21 = auVar21 ^ auVar23 ^ (undefined1  [16])dsfmt->status[0x75];
  uVar13 = auVar21._8_8_;
  auVar22._0_8_ = auVar21._0_8_ >> 0xc;
  auVar22._8_8_ = uVar13 >> 0xc;
  *(undefined1 (*) [16])array = auVar22 ^ auVar4 ^ _DAT_00132010 & auVar21;
  lVar15 = 0;
  uVar16 = auVar21._0_8_;
  do {
    uVar10 = *(ulong *)((long)dsfmt->status + lVar15 + 0x10);
    uVar18 = *(ulong *)((long)dsfmt->status + lVar15 + 0x18);
    uVar17 = (uVar13 << 0x20 | uVar13 >> 0x20) ^ uVar10 << 0x13 ^
             *(ulong *)((long)dsfmt->status + lVar15 + 0x760);
    uVar13 = (uVar16 << 0x20 | uVar16 >> 0x20) ^ uVar18 << 0x13 ^
             *(ulong *)((long)dsfmt->status + lVar15 + 0x768);
    *(ulong *)((long)array + lVar15 + 0x10) = uVar17 & 0xffafffffffb3f ^ uVar17 >> 0xc ^ uVar10;
    *(ulong *)((long)array + lVar15 + 0x18) = uVar13 & 0xffdfffc90fffd ^ uVar13 >> 0xc ^ uVar18;
    lVar15 = lVar15 + 0x10;
    uVar16 = uVar17;
  } while (lVar15 != 0x490);
  lVar15 = 0;
  do {
    uVar16 = *(ulong *)((long)dsfmt->status + lVar15 + 0x4a0);
    uVar10 = *(ulong *)((long)dsfmt->status + lVar15 + 0x4a8);
    uVar18 = (uVar13 << 0x20 | uVar13 >> 0x20) ^ uVar16 << 0x13 ^ *(ulong *)((long)array + lVar15);
    uVar13 = (uVar17 << 0x20 | uVar17 >> 0x20) ^ uVar10 << 0x13 ^
             *(ulong *)((long)array + lVar15 + 8);
    *(ulong *)((long)array + lVar15 + 0x4a0) = uVar18 & 0xffafffffffb3f ^ uVar18 >> 0xc ^ uVar16;
    *(ulong *)((long)array + lVar15 + 0x4a8) = uVar13 & 0xffdfffc90fffd ^ uVar13 >> 0xc ^ uVar10;
    lVar15 = lVar15 + 0x10;
    uVar17 = uVar18;
  } while (lVar15 != 0x750);
  uVar14 = (uint)size >> 1;
  uVar11 = 0xbf;
  if (0x2fc < (uint)size) {
    uVar11 = uVar14 - 0xbf;
    lVar15 = 0;
    do {
      uVar10 = uVar18 << 0x20;
      uVar17 = uVar18 >> 0x20;
      uVar16 = *(ulong *)((long)array + lVar15 + 8);
      uVar18 = *(ulong *)((long)array + lVar15) << 0x13 ^ (uVar13 << 0x20 | uVar13 >> 0x20) ^
               *(ulong *)((long)array + lVar15 + 0x750);
      uVar13 = uVar16 << 0x13 ^ (uVar10 | uVar17) ^ *(ulong *)((long)array + lVar15 + 0x758);
      *(ulong *)((long)array + lVar15 + 0xbf0) =
           uVar18 & 0xffafffffffb3f ^ uVar18 >> 0xc ^ *(ulong *)((long)array + lVar15);
      *(ulong *)((long)array + lVar15 + 0xbf8) = uVar13 & 0xffdfffc90fffd ^ uVar13 >> 0xc ^ uVar16;
      dVar7 = ((double *)((long)array + lVar15))[1];
      *(double *)((long)array + lVar15) = *(double *)((long)array + lVar15) + -1.0;
      ((double *)((long)array + lVar15))[1] = dVar7 + -1.0;
      lVar15 = lVar15 + 0x10;
    } while ((ulong)uVar11 * 0x10 + -0xbf0 != lVar15);
  }
  uVar16 = (ulong)uVar14;
  if ((uint)size < 0x2fc) {
    uVar10 = 1;
    if (1 < (int)(0x17e - uVar14)) {
      uVar10 = (ulong)(0x17e - uVar14);
    }
    lVar15 = 0;
    do {
      puVar1 = (undefined8 *)((long)array + lVar15 + uVar16 * 0x10 + -0xbf0);
      uVar8 = puVar1[1];
      puVar3 = (undefined8 *)((long)dsfmt->status + lVar15);
      *puVar3 = *puVar1;
      puVar3[1] = uVar8;
      lVar15 = lVar15 + 0x10;
    } while (uVar10 << 4 != lVar15);
  }
  else {
    uVar10 = 0;
  }
  if ((int)uVar11 < (int)uVar14) {
    uVar17 = (ulong)uVar11;
    lVar12 = uVar16 - uVar17;
    lVar15 = uVar17 * 0x10 + -0xbf0;
    lVar20 = 0;
    uVar19 = uVar18;
    do {
      uVar5 = *(ulong *)((long)array + lVar20 + lVar15);
      uVar6 = *(ulong *)((long)array + lVar20 + uVar17 * 0x10 + -0xbe8);
      uVar18 = (uVar13 << 0x20 | uVar13 >> 0x20) ^ uVar5 << 0x13 ^
               *(ulong *)((long)array + lVar20 + uVar17 * 0x10 + -0x4a0);
      uVar13 = (uVar19 << 0x20 | uVar19 >> 0x20) ^ uVar6 << 0x13 ^
               *(ulong *)((long)array + lVar20 + uVar17 * 0x10 + -0x498);
      *(ulong *)((long)array + lVar20 + uVar17 * 0x10) =
           uVar18 & 0xffafffffffb3f ^ uVar18 >> 0xc ^ uVar5;
      *(ulong *)((long)array + lVar20 + uVar17 * 0x10 + 8) =
           uVar13 & 0xffdfffc90fffd ^ uVar13 >> 0xc ^ uVar6;
      puVar3 = (undefined8 *)((long)array + lVar20 + uVar17 * 0x10);
      uVar8 = puVar3[1];
      puVar1 = (undefined8 *)((long)dsfmt->status + lVar20 + uVar10 * 0x10);
      *puVar1 = *puVar3;
      puVar1[1] = uVar8;
      pdVar9 = (double *)((long)array + lVar20 + lVar15);
      dVar7 = pdVar9[1];
      pdVar2 = (double *)((long)array + lVar20 + lVar15);
      *pdVar2 = *pdVar9 + -1.0;
      pdVar2[1] = dVar7 + -1.0;
      lVar20 = lVar20 + 0x10;
      lVar12 = lVar12 + -1;
      uVar19 = uVar18;
    } while (lVar12 != 0);
  }
  lVar15 = (uVar16 - uVar14) + 0xbf;
  pdVar9 = array + (ulong)uVar14 * 2 + -0x17e;
  do {
    *pdVar9 = *pdVar9 + -1.0;
    pdVar9[1] = pdVar9[1] + -1.0;
    pdVar9 = pdVar9 + 2;
    lVar15 = lVar15 + -1;
  } while (lVar15 != 0);
  dsfmt->status[0xbf].u[0] = uVar18;
  *(ulong *)((long)dsfmt->status + 0xbf8) = uVar13;
  return;
}

Assistant:

void dsfmt_fill_array_close_open(dsfmt_t* dsfmt, double array[], int size)
{
	assert(size % 2 == 0);
	assert(size >= DSFMT_N64);
	gen_rand_array_c0o1(dsfmt, (w128_t *)array, size / 2);
}